

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::NullStream::tryRead(NullStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  NullStream *this_local;
  
  constPromise<unsigned_long,_0UL>();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<size_t> NullStream::tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
  return kj::constPromise<size_t, 0>();
}